

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O0

int save_data(http_t *info,char *buf,int len)

{
  FILE *pFVar1;
  size_t sVar2;
  int *piVar3;
  int local_28;
  int write_len;
  int total_len;
  int len_local;
  char *buf_local;
  http_t *info_local;
  
  local_28 = len;
  if (info->save_file == (FILE *)0x0) {
    pFVar1 = fopen(info->save_path,"w");
    info->save_file = (FILE *)pFVar1;
    if (info->save_file == (FILE *)0x0) {
      if ((print_level & 4U) != 0) {
        printf("[%s][%s(%d)]:fopen %s error: %m\n","MSG_ERROR","save_data",0x132,info->save_path);
      }
      return -1;
    }
  }
  while( true ) {
    if (local_28 == 0) {
      return 0;
    }
    sVar2 = fwrite(buf,1,(long)len,(FILE *)info->save_file);
    if (((int)sVar2 < len) && (piVar3 = __errno_location(), *piVar3 != 4)) break;
    local_28 = local_28 - (int)sVar2;
  }
  if ((print_level & 4U) != 0) {
    printf("[%s][%s(%d)]:fwrite error: %m\n","MSG_ERROR","save_data",0x13a);
  }
  return -1;
}

Assistant:

int save_data(http_t *info, const char *buf, int len) {
  int total_len = len;
  int write_len = 0;

  // open file
  if (!info->save_file) {
    info->save_file = fopen(info->save_path, "w");
    if (!info->save_file) {
      lprintf(MSG_ERROR, "fopen %s error: %m\n", info->save_path);
      return -1;
    }
  }

  while (total_len) {
    write_len = fwrite(buf, sizeof(char), len, info->save_file);
    if (write_len < len && errno != EINTR) {
      lprintf(MSG_ERROR, "fwrite error: %m\n");
      return -1;
    }
    total_len -= write_len;
  }
  return 0;
}